

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblock.h
# Opt level: O2

TPZFMatrix<std::complex<double>_> * __thiscall
TPZBlock::Matrix<std::complex<double>>(TPZBlock *this)

{
  TPZFMatrix<std::complex<double>_> *pTVar1;
  ostream *poVar2;
  
  if (this->fpMatrix != (TPZBaseMatrix *)0x0) {
    pTVar1 = (TPZFMatrix<std::complex<double>_> *)
             __dynamic_cast(this->fpMatrix,&TPZBaseMatrix::typeinfo,
                            &TPZFMatrix<std::complex<double>>::typeinfo,0);
    if (pTVar1 != (TPZFMatrix<std::complex<double>_> *)0x0) {
      return pTVar1;
    }
  }
  std::operator<<((ostream *)&std::cerr,"Incompatible matrix type in ");
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "const TPZFMatrix<TVar> *TPZBlock::Matrix() const [TVar = std::complex<double>]"
                          );
  std::endl<char,std::char_traits<char>>(poVar2);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzblock.h",
             0x51);
}

Assistant:

const TPZFMatrix<TVar> *Matrix()const{
		if(auto tmp = dynamic_cast<const TPZFMatrix<TVar>*>(fpMatrix); tmp){
            return tmp;
        }
        else{
            PZError<<"Incompatible matrix type in ";
            PZError<<__PRETTY_FUNCTION__<<std::endl;
            DebugStop();
            return nullptr;
        }
	}